

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O0

Gia_Man_t * Gia_ManDupWithConstraints(Gia_Man_t *p,Vec_Int_t *vPoTypes)

{
  int iVar1;
  int iLit1;
  uint uVar2;
  Gia_Man_t *p_00;
  char *pcVar3;
  Gia_Obj_t *pGVar4;
  bool bVar5;
  int local_30;
  int local_2c;
  int nConstr;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *pNew;
  Vec_Int_t *vPoTypes_local;
  Gia_Man_t *p_local;
  
  local_30 = 0;
  iVar1 = Gia_ManObjNum(p);
  p_00 = Gia_ManStart(iVar1);
  pcVar3 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar3;
  pcVar3 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar3;
  pGVar4 = Gia_ManConst0(p);
  pGVar4->Value = 0;
  local_2c = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vCis);
    bVar5 = false;
    if (local_2c < iVar1) {
      _nConstr = Gia_ManCi(p,local_2c);
      bVar5 = _nConstr != (Gia_Obj_t *)0x0;
    }
    if (!bVar5) break;
    uVar2 = Gia_ManAppendCi(p_00);
    _nConstr->Value = uVar2;
    local_2c = local_2c + 1;
  }
  local_2c = 0;
  while( true ) {
    bVar5 = false;
    if (local_2c < p->nObjs) {
      _nConstr = Gia_ManObj(p,local_2c);
      bVar5 = _nConstr != (Gia_Obj_t *)0x0;
    }
    if (!bVar5) break;
    iVar1 = Gia_ObjIsAnd(_nConstr);
    if (iVar1 != 0) {
      iVar1 = Gia_ObjFanin0Copy(_nConstr);
      iLit1 = Gia_ObjFanin1Copy(_nConstr);
      uVar2 = Gia_ManAppendAnd(p_00,iVar1,iLit1);
      _nConstr->Value = uVar2;
    }
    local_2c = local_2c + 1;
  }
  local_2c = 0;
  while( true ) {
    iVar1 = Gia_ManPoNum(p);
    bVar5 = false;
    if (local_2c < iVar1) {
      _nConstr = Gia_ManCo(p,local_2c);
      bVar5 = _nConstr != (Gia_Obj_t *)0x0;
    }
    if (!bVar5) break;
    iVar1 = Vec_IntEntry(vPoTypes,local_2c);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjFanin0Copy(_nConstr);
      uVar2 = Gia_ManAppendCo(p_00,iVar1);
      _nConstr->Value = uVar2;
    }
    local_2c = local_2c + 1;
  }
  local_2c = 0;
  while( true ) {
    iVar1 = Gia_ManPoNum(p);
    bVar5 = false;
    if (local_2c < iVar1) {
      _nConstr = Gia_ManCo(p,local_2c);
      bVar5 = _nConstr != (Gia_Obj_t *)0x0;
    }
    if (!bVar5) break;
    iVar1 = Vec_IntEntry(vPoTypes,local_2c);
    if (iVar1 == 1) {
      uVar2 = Gia_ObjFanin0Copy(_nConstr);
      uVar2 = Gia_ManAppendCo(p_00,uVar2 ^ 1);
      _nConstr->Value = uVar2;
      local_30 = local_30 + 1;
    }
    local_2c = local_2c + 1;
  }
  local_2c = 0;
  while( true ) {
    iVar1 = Gia_ManRegNum(p);
    bVar5 = false;
    if (local_2c < iVar1) {
      iVar1 = Gia_ManPoNum(p);
      _nConstr = Gia_ManCo(p,iVar1 + local_2c);
      bVar5 = _nConstr != (Gia_Obj_t *)0x0;
    }
    if (!bVar5) break;
    iVar1 = Gia_ObjFanin0Copy(_nConstr);
    uVar2 = Gia_ManAppendCo(p_00,iVar1);
    _nConstr->Value = uVar2;
    local_2c = local_2c + 1;
  }
  iVar1 = Gia_ManRegNum(p);
  Gia_ManSetRegNum(p_00,iVar1);
  p_00->nConstrs = local_30;
  iVar1 = Gia_ManIsNormalized(p_00);
  if (iVar1 == 0) {
    __assert_fail("Gia_ManIsNormalized(pNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                  ,0xd40,"Gia_Man_t *Gia_ManDupWithConstraints(Gia_Man_t *, Vec_Int_t *)");
  }
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManDupWithConstraints( Gia_Man_t * p, Vec_Int_t * vPoTypes )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i, nConstr = 0;
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    Gia_ManForEachAnd( p, pObj, i )
        pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachPo( p, pObj, i )
        if ( Vec_IntEntry(vPoTypes, i) == 0 ) // regular PO
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManForEachPo( p, pObj, i )
        if ( Vec_IntEntry(vPoTypes, i) == 1 ) // constraint (should be complemented!)
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) ^ 1 ), nConstr++;
    Gia_ManForEachRi( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
//    Gia_ManDupRemapEquiv( pNew, p );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    pNew->nConstrs = nConstr;
    assert( Gia_ManIsNormalized(pNew) );
    return pNew;
}